

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxskin.cpp
# Opt level: O0

int32 rw::xbox::getSizeNativeSkin(void *object,int32 offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Skin *skin_00;
  int32 iVar4;
  NativeSkin *natskin;
  Skin *skin;
  Geometry *geometry;
  int32 offset_local;
  void *object_local;
  
  skin_00 = *(Skin **)((long)object + (long)offset);
  if (skin_00 == (Skin *)0x0) {
    object_local._4_4_ = -1;
  }
  else if (skin_00->platformData == (void *)0x0) {
    object_local._4_4_ = -1;
  }
  else {
    iVar1 = *(int *)((long)skin_00->platformData + 0x810);
    iVar2 = *(int *)((long)object + 0x1c);
    iVar3 = skin_00->numBones;
    iVar4 = skinSplitDataSize(skin_00);
    object_local._4_4_ = iVar1 * iVar2 + 0x824 + iVar3 * 0x40 + iVar4;
  }
  return object_local._4_4_;
}

Assistant:

int32
getSizeNativeSkin(void *object, int32 offset)
{
	Geometry *geometry = (Geometry*)object;
	Skin *skin = *PLUGINOFFSET(Skin*, object, offset);
	if(skin == nil)
		return -1;
	if(skin->platformData == nil)
		return -1;
	NativeSkin *natskin = (NativeSkin*)skin->platformData;
	return 12 + 8 + 2*256*4 + 4*4 +
	        natskin->stride*geometry->numVertices + skin->numBones*64 +
		skinSplitDataSize(skin);
}